

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

HelicsBroker helicsBrokerClone(HelicsBroker broker,HelicsError *err)

{
  BrokerObject *pBVar1;
  _Head_base<0UL,_helics::BrokerObject_*,_false> _Var2;
  __single_object brokerClone;
  _Head_base<0UL,_helics::BrokerObject_*,_false> local_30;
  __uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> local_28;
  MasterObjectHolder *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  pBVar1 = helics::getBrokerObject(broker,err);
  if (pBVar1 == (BrokerObject *)0x0) {
    _Var2._M_head_impl = (BrokerObject *)0x0;
  }
  else {
    std::make_unique<helics::BrokerObject>();
    (local_30._M_head_impl)->valid = -0x5cb982e0;
    std::__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)local_30._M_head_impl,
               (__shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
    _Var2._M_head_impl = local_30._M_head_impl;
    getMasterHolder();
    local_28._M_t.
    super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>.
    super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl =
         (tuple<helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>)
         (tuple<helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>)
         local_30._M_head_impl;
    local_30._M_head_impl = (BrokerObject *)0x0;
    MasterObjectHolder::addBroker
              (local_20,(unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                         *)&local_28);
    std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>::~unique_ptr
              ((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *)
               &local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18);
    std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>::~unique_ptr
              ((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *)
               &local_30);
  }
  return _Var2._M_head_impl;
}

Assistant:

HelicsBroker helicsBrokerClone(HelicsBroker broker, HelicsError* err)
{
    auto* brokerObj = helics::getBrokerObject(broker, err);
    if (brokerObj == nullptr) {
        return nullptr;
    }
    auto brokerClone = std::make_unique<helics::BrokerObject>();
    brokerClone->valid = gBrokerValidationIdentifier;
    brokerClone->brokerptr = brokerObj->brokerptr;
    auto* retbroker = reinterpret_cast<HelicsBroker>(brokerClone.get());
    getMasterHolder()->addBroker(std::move(brokerClone));
    return retbroker;
}